

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O1

void __thiscall vfs::posix_watcher::run(posix_watcher *this,bool folders,bool files)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  void *unaff_RBX;
  value_type *__val;
  long lVar7;
  string local_e8;
  _union_1457 local_c8;
  sigset_t local_c0;
  
  local_c8.sa_handler = (__sighandler_t)0x0;
  sigemptyset(&local_c0);
  sigaction(10,(sigaction *)&local_c8,(sigaction *)0x0);
  if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013b74e:
    uVar6 = std::__throw_bad_function_call();
    operator_delete(unaff_RBX,0x1000);
    _Unwind_Resume(uVar6);
  }
  (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&this->dir_);
  unaff_RBX = operator_new(0x1000);
  memset(unaff_RBX,0,0x1000);
  if (((this->running_)._M_base._M_i & 1U) != 0) {
    while (sVar4 = read(this->inotifyFd_,unaff_RBX,0x1000), sVar4 != -1) {
      iVar3 = 0;
      while (lVar7 = (long)iVar3, lVar7 < sVar4) {
        uVar1 = *(uint *)((long)unaff_RBX + lVar7 + 4);
        if ((short)uVar1 < 0) {
          if (((this->running_)._M_base._M_i & 1U) != 0) goto LAB_0013b6e4;
          bVar2 = false;
        }
        else {
          if ((uVar1 >> 0x1e & 1) == 0) {
            if (*(int *)((long)unaff_RBX + lVar7 + 0xc) != 0 && files) {
LAB_0013b6d3:
              if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
                goto LAB_0013b74e;
              }
              (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&this->dir_);
            }
          }
          else if (folders) goto LAB_0013b6d3;
LAB_0013b6e4:
          iVar3 = *(int *)((long)unaff_RBX + lVar7 + 0xc) + iVar3 + 0x10;
          bVar2 = true;
        }
        if (!bVar2) goto LAB_0013b700;
      }
      if (((this->running_)._M_base._M_i & 1U) == 0) goto LAB_0013b700;
    }
    piVar5 = __errno_location();
    get_last_error_as_string_abi_cxx11_(&local_e8,*piVar5);
    run();
  }
LAB_0013b700:
  operator_delete(unaff_RBX,0x1000);
  return;
}

Assistant:

void run(bool folders, bool files)
        {
            // This is set up to end the thread if killed by SIGUSR1.
            struct sigaction sa;
            sa.sa_handler   = nullptr;
            sa.sa_sigaction = nullptr;
            sigemptyset(&sa.sa_mask);
            sigaction(SIGUSR1, &sa, nullptr);

            // Call the callback in case we have some folders in there waiting before we started the process
            callback_(dir_);

            constexpr auto maxNumEventsToRead   = 128;
            constexpr auto eventSize            = sizeof(struct inotify_event);
            constexpr auto bufferLength         = maxNumEventsToRead*(eventSize+16);
            auto eventBuffer                    = std::vector<uint8_t>(bufferLength);

            while (running_)
            {
                // Multiple events can be read at a time.
                auto eventBufferOffset = 0;

                // Will block until a new event takes place.
                const auto sizeReadInBytes = read(inotifyFd_, eventBuffer.data(), bufferLength);
                if(sizeReadInBytes == -1)
                {
                    vfs_errorf("read() of inotify file descriptor failed with error: %s",
                               get_last_error_as_string(errno).c_str());
                    return;
                }

                while (eventBufferOffset < sizeReadInBytes)
                {
                    const auto pEvent = reinterpret_cast<struct inotify_event *>(&eventBuffer[eventBufferOffset]);

                    if ((pEvent->mask & IN_IGNORED) != 0)
                    {
                        // IN_IGNORED is set when the caller thread removes watch.
                        // This can also happen when the watched file/directory was deleted
                        // or the filesystem was unmounted.
                        if(running_ == false)
                        {
                            return;
                        }
                    }
                    else if((pEvent->mask & IN_ISDIR) != 0)
                    {
                        if (folders)
                        {
                            // A directory has been created/deleted.
                            callback_(dir_);
                        }
                    }
                    else if (pEvent->len != 0)
                    {
                        if (files)
                        {
                            // A file has been created/deleted.
                            callback_(dir_);
                        }
                    }

                    eventBufferOffset += eventSize + pEvent->len;
                }
            }
        }